

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseStageMeta
          (AsciiParser *this,pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *out)

{
  undefined4 uVar1;
  bool bVar2;
  ostream *poVar3;
  value_type *rhs;
  type *ptVar4;
  type *this_00;
  undefined1 local_540 [8];
  MetaVariable var;
  value_type vardef;
  undefined1 local_430 [8];
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pvardef;
  ostringstream local_3a0 [8];
  ostringstream ss_e_1;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  undefined1 local_48 [8];
  string varname;
  ListEditQual qual;
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *out_local;
  AsciiParser *this_local;
  
  bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (bVar2) {
    varname.field_2._12_4_ = 0;
    bVar2 = MaybeListEditQual(this,(ListEditQual *)(varname.field_2._M_local_buf + 0xc));
    if (bVar2) {
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (bVar2) {
        ::std::__cxx11::string::string((string *)local_48);
        bVar2 = ReadIdentifier(this,(string *)local_48);
        if (bVar2) {
          bVar2 = IsStageMeta(this,(string *)local_48);
          if (bVar2) {
            bVar2 = SkipWhitespaceAndNewline(this,true);
            if (bVar2) {
              bVar2 = Expect(this,'=');
              if (bVar2) {
                bVar2 = SkipWhitespaceAndNewline(this,true);
                if (bVar2) {
                  GetStageMetaDefinition
                            ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                             &vardef.post_parse_handler._M_invoker,this,(string *)local_48);
                  nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                  optional<tinyusdz::ascii::AsciiParser::VariableDef,_0>
                            ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_430,
                             (optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                             &vardef.post_parse_handler._M_invoker);
                  nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                  ~optional((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                            &vardef.post_parse_handler._M_invoker);
                  bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool
                                    ((optional *)local_430);
                  if (bVar2) {
                    rhs = nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>
                          ::operator*((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                                      local_430);
                    VariableDef::VariableDef((VariableDef *)((long)&var._name.field_2 + 8),rhs);
                    MetaVariable::MetaVariable((MetaVariable *)local_540);
                    this_local._7_1_ =
                         ParseMetaValue(this,(VariableDef *)((long)&var._name.field_2 + 8),
                                        (MetaVariable *)local_540);
                    if (this_local._7_1_) {
                      MetaVariable::set_name((MetaVariable *)local_540,(string *)local_48);
                      uVar1 = varname.field_2._12_4_;
                      ptVar4 = ::std::get<0ul,tinyusdz::ListEditQual,tinyusdz::MetaVariable>(out);
                      *ptVar4 = uVar1;
                      this_00 = ::std::get<1ul,tinyusdz::ListEditQual,tinyusdz::MetaVariable>(out);
                      MetaVariable::operator=(this_00,(MetaVariable *)local_540);
                    }
                    MetaVariable::~MetaVariable((MetaVariable *)local_540);
                    VariableDef::~VariableDef((VariableDef *)((long)&var._name.field_2 + 8));
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                  nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                  ~optional((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)local_430);
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_3a0);
                poVar3 = ::std::operator<<((ostream *)local_3a0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseStageMeta");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbe8);
                ::std::operator<<(poVar3," ");
                poVar3 = ::std::operator<<((ostream *)local_3a0,"`=` expected.");
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)((long)&pvardef.contained + 0x60));
                ::std::__cxx11::string::~string((string *)((long)&pvardef.contained + 0x60));
                this_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_3a0);
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1c8);
            poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseStageMeta");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbe0);
            ::std::operator<<(poVar3," ");
            ::std::operator+(&local_208,"Unsupported or invalid/empty variable name `",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48);
            ::std::operator+(&local_1e8,&local_208,"` for Stage metadatum");
            poVar3 = ::std::operator<<((ostream *)local_1c8,(string *)&local_1e8);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)&local_1e8);
            ::std::__cxx11::string::~string((string *)&local_208);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_228);
            ::std::__cxx11::string::~string((string *)&local_228);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
          }
        }
        else {
          this_local._7_1_ = false;
        }
        ::std::__cxx11::string::~string((string *)local_48);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseStageMeta(std::pair<ListEditQual, MetaVariable> *out) {
  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  tinyusdz::ListEditQual qual{ListEditQual::ResetToExplicit};
  if (!MaybeListEditQual(&qual)) {
    return false;
  }

  DCOUT("list-edit qual: " << tinyusdz::to_string(qual));

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return false;
  }

  // std::cout << "varname = `" << varname << "`\n";

  if (!IsStageMeta(varname)) {
    PUSH_ERROR_AND_RETURN("Unsupported or invalid/empty variable name `" +
                          varname + "` for Stage metadatum");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('=')) {
    PUSH_ERROR_AND_RETURN("`=` expected.");
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  auto pvardef = GetStageMetaDefinition(varname);
  if (!pvardef) {
    // This should not happen though;
    return false;
  }

  auto vardef = (*pvardef);

  MetaVariable var;
  if (!ParseMetaValue(vardef, &var)) {
    return false;
  }
  var.set_name(varname);

  std::get<0>(*out) = qual;
  std::get<1>(*out) = var;

  return true;
}